

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O3

SequenceD<64> * __thiscall
DES::operator()(SequenceD<64> *__return_storage_ptr__,DES *this,SequenceD<64> *seq)

{
  Sequence *seq_00;
  deque<int,_std::allocator<int>_> *this_00;
  deque<int,_std::allocator<int>_> *this_01;
  int iVar1;
  Sequence tmpSeq;
  SequenceD<64> swapSeq;
  SequenceD<64> tmp;
  Sequence xorSeq;
  F f;
  Sequence local_358;
  Sequence local_300;
  SequenceD<64> local_2a8;
  SequenceD<64> local_1f8;
  Sequence local_148;
  F local_f0;
  
  F::F(&local_f0,&this->m_key);
  Permutation<64,_64>::operator()
            (&local_1f8,(Permutation<64,_64> *)&local_2a8,seq,&INITIAL_PERMUTATION);
  seq_00 = &local_1f8.m_other;
  this_00 = &local_2a8.super_Sequence.m_bits;
  this_01 = &local_2a8.m_other.m_bits;
  iVar1 = 0x10;
  do {
    F::operator()(&local_300,&local_f0,seq_00);
    local_358._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::deque<int,_std::allocator<int>_>::deque(&local_358.m_bits,&local_300.m_bits);
    Sequence::operator*(&local_148,&local_1f8.super_Sequence,&local_358);
    local_358._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_358.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    SequenceD<64>::SequenceD(&local_2a8,seq_00,&local_148);
    std::deque<int,_std::allocator<int>_>::operator=(&local_1f8.super_Sequence.m_bits,this_00);
    std::deque<int,_std::allocator<int>_>::operator=(&local_1f8.m_other.m_bits,this_01);
    local_2a8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
    local_2a8.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&this_01->super__Deque_base<int,_std::allocator<int>_>);
    local_2a8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&this_00->super__Deque_base<int,_std::allocator<int>_>);
    local_148._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_148.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    local_300._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&local_300.m_bits.super__Deque_base<int,_std::allocator<int>_>);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  SequenceD<64>::SequenceD(&local_2a8,seq_00,&local_1f8.super_Sequence);
  Permutation<64,_64>::operator()
            (__return_storage_ptr__,(Permutation<64,_64> *)&local_300,&local_2a8,
             &INITIAL_PERMUTATION_REVERSE);
  local_2a8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_2a8.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_2a8.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_2a8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_2a8.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_1f8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_1f8.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_1f8.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_1f8.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_1f8.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  S_function::~S_function(&local_f0.m_sFunction);
  local_f0.m_keyGen.m_rolling.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d30;
  local_f0.m_keyGen.m_rolling.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_f0.m_keyGen.m_rolling.m_other.m_bits.
              super__Deque_base<int,_std::allocator<int>_>);
  local_f0.m_keyGen.m_rolling.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_f0.m_keyGen.m_rolling.super_Sequence.m_bits.
              super__Deque_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

SequenceD<64> DES::operator()(SequenceD<64> seq) {
    F f(m_key);
    // Initial permutation
    auto tmp = Permutation<64, 64>{}(seq, INITIAL_PERMUTATION);

    // For each round, compute the intermediate sequence
    for (auto i = 0; i < 16; ++i) {
        auto tmpSeq = f(tmp.right());
        auto xorSeq = tmp.left() * tmpSeq;
        tmp = SequenceD<64>{tmp.right(), xorSeq};
    }

    // Final byte swao and permutation
    auto swapSeq = SequenceD<64>{tmp.right(), tmp.left()};
    return Permutation<64, 64>{}(swapSeq, INITIAL_PERMUTATION_REVERSE);
}